

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O3

MQTTCODEC_HANDLE mqtt_codec_create(ON_PACKET_COMPLETE_CALLBACK packetComplete,void *callbackCtx)

{
  MQTTCODEC_HANDLE pMVar1;
  
  pMVar1 = (MQTTCODEC_HANDLE)malloc(0x40);
  if (pMVar1 != (MQTTCODEC_HANDLE)0x0) {
    pMVar1->currPacket = UNKNOWN_TYPE;
    pMVar1->codecState = CODEC_STATE_FIXED_HEADER;
    pMVar1->headerFlags = 0;
    pMVar1->bufferOffset = 0;
    pMVar1->headerData = (BUFFER_HANDLE)0x0;
    pMVar1->storeRemainLen[0] = '\0';
    pMVar1->storeRemainLen[1] = '\0';
    pMVar1->storeRemainLen[2] = '\0';
    pMVar1->storeRemainLen[3] = '\0';
    pMVar1->remainLenIndex = 0;
    pMVar1->packetComplete = packetComplete;
    pMVar1->callContext = callbackCtx;
  }
  return pMVar1;
}

Assistant:

MQTTCODEC_HANDLE mqtt_codec_create(ON_PACKET_COMPLETE_CALLBACK packetComplete, void* callbackCtx)
{
    MQTTCODEC_HANDLE result;
    result = malloc(sizeof(MQTTCODEC_INSTANCE));
    /* Codes_SRS_MQTT_CODEC_07_001: [If a failure is encountered then mqtt_codec_create shall return NULL.] */
    if (result != NULL)
    {
        /* Codes_SRS_MQTT_CODEC_07_002: [On success mqtt_codec_create shall return a MQTTCODEC_HANDLE value.] */
        clear_codec_data(result);
        result->packetComplete = packetComplete;
        result->callContext = callbackCtx;
    }
    return result;
}